

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O0

vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *
chaiscript::dispatch::detail::
build_param_type_list<bool,henson::NameMap_const&,std::__cxx11::string_const&>
          (_func_bool_NameMap_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
           *param_1)

{
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *in_RDI;
  allocator_type *in_stack_ffffffffffffff88;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *in_stack_ffffffffffffff90;
  initializer_list<chaiscript::Type_Info> in_stack_ffffffffffffff98;
  
  user_type<bool>();
  user_type<henson::NameMap_const&>();
  user_type<std::__cxx11::string_const&>();
  std::allocator<chaiscript::Type_Info>::allocator((allocator<chaiscript::Type_Info> *)0x30b78f);
  std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::vector
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff98,in_stack_ffffffffffffff88);
  std::allocator<chaiscript::Type_Info>::~allocator((allocator<chaiscript::Type_Info> *)0x30b7ba);
  return in_RDI;
}

Assistant:

std::vector<Type_Info> build_param_type_list(Ret (*)(Params...))
        {
          /// \note somehow this is responsible for a large part of the code generation
          return { user_type<Ret>(), user_type<Params>()... };
        }